

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

double sexp_half_to_double(unsigned_short x)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ushort in_DI;
  float fVar4;
  uint v;
  uint m;
  uint e;
  undefined8 local_8;
  
  if (in_DI == 0x7c00) {
    local_8 = INFINITY;
  }
  else if (in_DI == 0x7fff) {
    local_8 = NAN;
  }
  else if (in_DI == 0xfc00) {
    local_8 = -INFINITY;
  }
  else {
    uVar1 = in_DI >> 10;
    uVar2 = (in_DI & 0x3ff) << 0xd;
    uVar3 = float_as_int((float)uVar2);
    fVar4 = int_as_float((in_DI & 0x8000) << 0x10 |
                         (uint)((uVar1 & 0x1f) != 0) * (((uVar1 & 0x1f) + 0x70) * 0x800000 | uVar2)
                         | (uint)((uVar1 & 0x1f) == 0 && (in_DI & 0x3ff) != 0) *
                           (((uVar3 >> 0x17) - 0x25) * 0x800000 |
                           uVar2 << (0x96U - (char)(uVar3 >> 0x17) & 0x1f) & 0x7fe000));
    local_8 = (double)fVar4;
  }
  return local_8;
}

Assistant:

double sexp_half_to_double(unsigned short x) {
  unsigned int e, m, v;
  if (x == 31744) return INFINITY;
  if (x == 32767) return NAN;
  if (x == 64512) return -INFINITY;
  e = (x&0x7C00)>>10;
  m = (x&0x03FF)<<13;
  v = float_as_int((float)m)>>23;
  return int_as_float((x&0x8000)<<16 | (e!=0)*((e+112)<<23|m) | ((e==0)&(m!=0))*((v-37)<<23|((m<<(150-v))&0x007FE000)));
}